

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O3

uc_afl_ret __thiscall UCAFL::set_exits(UCAFL *this,uint64_t *exits,size_t exit_count)

{
  int iVar1;
  uc_afl_ret uVar2;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar3;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> v;
  void *local_38;
  undefined8 uStack_30;
  long local_28;
  
  local_38 = (void *)0x0;
  uStack_30 = 0;
  local_28 = 0;
  iVar1 = uc_ctl(this->uc_,0x44000004,1);
  uVar3 = extraout_XMM0_Da;
  uVar4 = extraout_XMM0_Db;
  if (iVar1 == 0) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::_M_assign_aux<unsigned_long_const*>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_38,exits,
               exits + exit_count);
    uVar2 = UC_AFL_RET_OK;
    iVar1 = uc_ctl(this->uc_,0x48000006,local_38,exit_count);
    uVar3 = extraout_XMM0_Da_00;
    uVar4 = extraout_XMM0_Db_00;
    if (iVar1 == 0) goto LAB_00102c36;
  }
  log((double)CONCAT44(uVar4,uVar3));
  uVar2 = UC_AFL_RET_ERROR;
LAB_00102c36:
  if (local_38 != (void *)0x0) {
    operator_delete(local_38,local_28 - (long)local_38);
  }
  return uVar2;
}

Assistant:

uc_afl_ret set_exits(const uint64_t* exits, size_t exit_count) {
        uc_err err;
        std::vector<uint64_t> v;

        err = uc_ctl_exits_enable(this->uc_);
        if (err) {
            ERR("Fail to enable exits for Unicorn Engine.\n");
            return UC_AFL_RET_ERROR;
        }

        v.assign(exits, exits + exit_count);
        err = uc_ctl_set_exits(uc_, (uint64_t*)&v[0], exit_count);

        if (err) {
            ERR("Fail to set exits.\n");
            return UC_AFL_RET_ERROR;
        }

        return UC_AFL_RET_OK;
    }